

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindCommon.cxx
# Opt level: O2

void __thiscall
cmFindCommon::RerootPaths
          (cmFindCommon *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  pointer pbVar3;
  cmValue cVar4;
  cmValue __args;
  cmValue __args_00;
  cmValue value;
  string *extraout_RDX;
  string *psVar5;
  string *r_00;
  string *extraout_RDX_00;
  pointer l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *r;
  string *psVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char local_c9;
  string rootedDir;
  cmList roots;
  char *split;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrootedPaths;
  string local_50;
  
  if (this->FindRootPathMode != RootPathModeNever) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rootedDir,"CMAKE_SYSROOT",(allocator<char> *)&local_50);
    cVar4 = cmMakefile::GetDefinition(pcVar1,&rootedDir);
    std::__cxx11::string::~string((string *)&rootedDir);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rootedDir,"CMAKE_SYSROOT_COMPILE",(allocator<char> *)&local_50);
    __args = cmMakefile::GetDefinition(pcVar1,&rootedDir);
    std::__cxx11::string::~string((string *)&rootedDir);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rootedDir,"CMAKE_SYSROOT_LINK",(allocator<char> *)&local_50);
    __args_00 = cmMakefile::GetDefinition(pcVar1,&rootedDir);
    std::__cxx11::string::~string((string *)&rootedDir);
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&rootedDir,"CMAKE_FIND_ROOT_PATH",(allocator<char> *)&local_50);
    value = cmMakefile::GetDefinition(pcVar1,&rootedDir);
    std::__cxx11::string::~string((string *)&rootedDir);
    if (cVar4.Value == (string *)0x0) {
      bVar7 = false;
    }
    else {
      bVar7 = (cVar4.Value)->_M_string_length != 0;
    }
    if (__args.Value == (string *)0x0) {
      bVar8 = false;
    }
    else {
      bVar8 = (__args.Value)->_M_string_length != 0;
    }
    if (__args_00.Value == (string *)0x0) {
      bVar9 = false;
    }
    else {
      bVar9 = (__args_00.Value)->_M_string_length != 0;
    }
    if (value.Value == (string *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = (value.Value)->_M_string_length != 0;
    }
    if (((bVar7 || bVar8) || bVar9) || (bVar10)) {
      roots.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      roots.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      roots.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (value.Value != (string *)0x0) {
        cmList::assign(&roots,value.Value,Yes,No);
      }
      if (__args.Value != (string *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&roots,
                   __args.Value);
      }
      if (__args_00.Value != (string *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&roots,
                   __args_00.Value);
      }
      psVar6 = roots.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar5 = roots.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (cVar4.Value != (string *)0x0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string_const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&roots,
                   cVar4.Value);
        psVar6 = roots.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        psVar5 = roots.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; psVar6 != psVar5; psVar6 = psVar6 + 1) {
        cmsys::SystemTools::ConvertToUnixSlashes(psVar6);
      }
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&rootedDir,"CMAKE_STAGING_PREFIX",(allocator<char> *)&local_50);
      cVar4 = cmMakefile::GetDefinition(pcVar1,&rootedDir);
      std::__cxx11::string::~string((string *)&rootedDir);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&unrootedPaths,paths);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(paths);
      pbVar2 = roots.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      psVar5 = extraout_RDX;
      for (l = roots.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          pbVar3 = unrootedPaths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
          psVar6 = unrootedPaths.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start, l != pbVar2; l = l + 1) {
        for (; psVar6 != pbVar3; psVar6 = psVar6 + 1) {
          rootedDir._M_dataplus._M_p = (pointer)&rootedDir.field_2;
          rootedDir._M_string_length = 0;
          rootedDir.field_2._M_local_buf[0] = '\0';
          bVar7 = RerootPaths::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)psVar6,l,psVar5);
          if ((bVar7) ||
             ((cVar4.Value != (string *)0x0 &&
              (bVar7 = RerootPaths::anon_class_1_0_00000001::operator()
                                 ((anon_class_1_0_00000001 *)psVar6,cVar4.Value,r_00), bVar7)))) {
            std::__cxx11::string::_M_assign((string *)&rootedDir);
          }
          else if ((psVar6->_M_string_length != 0) && (*(psVar6->_M_dataplus)._M_p != '~')) {
            split = cmsys::SystemTools::SplitPathRootComponent(psVar6,(string *)0x0);
            if ((split == (char *)0x0) || (*split == '\0')) {
              std::__cxx11::string::_M_assign((string *)&rootedDir);
            }
            else {
              local_c9 = '/';
              cmStrCat<std::__cxx11::string_const&,char,char_const*&>(&local_50,l,&local_c9,&split);
              std::__cxx11::string::operator=((string *)&rootedDir,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(paths,&rootedDir);
          std::__cxx11::string::~string((string *)&rootedDir);
          psVar5 = extraout_RDX_00;
        }
      }
      if (this->FindRootPathMode == RootPathModeBoth) {
        ::cm::
        append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                  (paths,&unrootedPaths);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&unrootedPaths);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&roots.Values);
    }
  }
  return;
}

Assistant:

void cmFindCommon::RerootPaths(std::vector<std::string>& paths)
{
#if 0
  for(std::string const& p : paths)
    {
    fprintf(stderr, "[%s]\n", p.c_str());
    }
#endif
  // Short-circuit if there is nothing to do.
  if (this->FindRootPathMode == RootPathModeNever) {
    return;
  }

  cmValue sysroot = this->Makefile->GetDefinition("CMAKE_SYSROOT");
  cmValue sysrootCompile =
    this->Makefile->GetDefinition("CMAKE_SYSROOT_COMPILE");
  cmValue sysrootLink = this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK");
  cmValue rootPath = this->Makefile->GetDefinition("CMAKE_FIND_ROOT_PATH");
  const bool noSysroot = !cmNonempty(sysroot);
  const bool noCompileSysroot = !cmNonempty(sysrootCompile);
  const bool noLinkSysroot = !cmNonempty(sysrootLink);
  const bool noRootPath = !cmNonempty(rootPath);
  if (noSysroot && noCompileSysroot && noLinkSysroot && noRootPath) {
    return;
  }

  // Construct the list of path roots with no trailing slashes.
  cmList roots;
  if (rootPath) {
    roots.assign(*rootPath);
  }
  if (sysrootCompile) {
    roots.emplace_back(*sysrootCompile);
  }
  if (sysrootLink) {
    roots.emplace_back(*sysrootLink);
  }
  if (sysroot) {
    roots.emplace_back(*sysroot);
  }
  for (auto& r : roots) {
    cmSystemTools::ConvertToUnixSlashes(r);
  }

  cmValue stagePrefix = this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");

  // Copy the original set of unrooted paths.
  auto unrootedPaths = paths;
  paths.clear();

  auto isSameDirectoryOrSubDirectory = [](std::string const& l,
                                          std::string const& r) {
    return (cmSystemTools::GetRealPath(l) == cmSystemTools::GetRealPath(r)) ||
      cmSystemTools::IsSubDirectory(l, r);
  };

  for (auto const& r : roots) {
    for (auto const& up : unrootedPaths) {
      // Place the unrooted path under the current root if it is not
      // already inside.  Skip the unrooted path if it is relative to
      // a user home directory or is empty.
      std::string rootedDir;
      if (isSameDirectoryOrSubDirectory(up, r) ||
          (stagePrefix && isSameDirectoryOrSubDirectory(up, *stagePrefix))) {
        rootedDir = up;
      } else if (!up.empty() && up[0] != '~') {
        auto const* split = cmSystemTools::SplitPathRootComponent(up);
        if (split && *split) {
          // Start with the new root.
          rootedDir = cmStrCat(r, '/', split);
        } else {
          rootedDir = r;
        }
      }

      // Store the new path.
      paths.push_back(rootedDir);
    }
  }

  // If searching both rooted and unrooted paths add the original
  // paths again.
  if (this->FindRootPathMode == RootPathModeBoth) {
    cm::append(paths, unrootedPaths);
  }
}